

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O3

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
::LinearizeProductWithBinaryVar
          (LinTerms *__return_storage_ptr__,
          QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_0>
          *this,double c,int x,int y)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  pointer pdVar6;
  pointer pdVar7;
  Error *this_01;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  NodeRange NVar11;
  VarOrConst VVar12;
  Var local_6c;
  pointer local_68;
  CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
  local_60;
  
  uVar8 = (ulong)(uint)y;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.
             m_data.m_storage;
  (__return_storage_ptr__->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
       (ptr)&(__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data
             .m_storage;
  (__return_storage_ptr__->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)(this->
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mdl_cvt_;
  pdVar6 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar7 = (this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar2 = pdVar6[x];
  dVar3 = pdVar7[x];
  local_68 = (pointer)c;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    if (dVar2 == 1.0) {
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) goto LAB_0018aceb;
    }
    else {
LAB_0018aceb:
      dVar4 = pdVar6[y];
      dVar5 = pdVar7[y];
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        if ((dVar4 != 1.0) || (NAN(dVar4))) goto LAB_0018ae4a;
LAB_0018ad3b:
        bVar9 = NAN(dVar4) || NAN(dVar5);
        bVar10 = dVar4 == dVar5;
LAB_0018ad3f:
        if ((!bVar10) || (bVar9)) {
LAB_0018ae4a:
          this_01 = (Error *)__cxa_allocate_exception(0x18);
          Error::Error(this_01,(CStringRef)0x37ef2c,-1);
          __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
        }
      }
      else {
        if ((dVar5 != 1.0) || (NAN(dVar5))) goto LAB_0018ad3b;
        if ((this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_type_.
            super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
            super__Vector_impl_data._M_start[y] != INTEGER) {
          bVar9 = NAN(dVar4);
          bVar10 = dVar4 == 1.0;
          goto LAB_0018ad3f;
        }
      }
      if ((dVar2 == 0.0) && (!NAN(dVar2))) goto LAB_0018ad57;
    }
    if ((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) {
      bVar9 = NAN(dVar2);
      bVar10 = dVar2 == 1.0;
      goto LAB_0018ad86;
    }
  }
  else {
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      bVar9 = NAN(dVar2) || NAN(dVar3);
      bVar10 = dVar2 == dVar3;
LAB_0018ace7:
      if ((!bVar10) || (bVar9)) goto LAB_0018aceb;
    }
    else if ((this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_type_.
             super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
             super__Vector_impl_data._M_start[x] != INTEGER) {
      bVar9 = NAN(dVar2);
      bVar10 = dVar2 == 1.0;
      goto LAB_0018ace7;
    }
LAB_0018ad57:
    if (((dVar3 == 1.0) && (!NAN(dVar3))) &&
       ((this_00->super_FlatModel<mp::DefaultFlatModelParams>).var_type_.
        super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
        super__Vector_impl_data._M_start[x] == INTEGER)) goto LAB_0018ad94;
    bVar9 = NAN(dVar2) || NAN(dVar3);
    bVar10 = dVar2 == dVar3;
LAB_0018ad86:
    if ((bVar10) && (!bVar9)) goto LAB_0018ad94;
  }
  uVar8 = (ulong)(uint)x;
  x = y;
LAB_0018ad94:
  NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::MakeFixedVar(this_00,0.0);
  local_60.super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>.
  args_._M_elems._0_8_ = (ulong)(uint)x | uVar8 << 0x20;
  paVar1 = &local_60.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_60.super_FunctionalConstraint.result_var_ = -1;
  local_60.super_FunctionalConstraint.ctx.value_ = CTX_NONE;
  local_60.super_CustomConstraintData<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::IfThenId>.
  args_._M_elems[2] = NVar11.ir_.beg_;
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1
  ;
  VVar12 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
           ::
           AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
                     ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                       *)this_00,&local_60);
  value = VVar12.field_1;
  if (((undefined1  [16])VVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    NVar11 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::MakeFixedVar(this_00,value.c_);
    value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar11.ir_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar1)
  {
    operator_delete(local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,CONCAT71(local_60.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_allocated_capacity._1_7_,
                              local_60.super_FunctionalConstraint.super_BasicConstraint.name_.
                              field_2._M_local_buf[0]) + 1);
  }
  local_60.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p = local_68;
  local_6c = value.var_;
  gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
            ((small_vector_base<std::allocator<double>,6u> *)__return_storage_ptr__,
             (double *)&local_60);
  gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
            ((small_vector_base<std::allocator<int>,6u> *)&__return_storage_ptr__->vars_,&local_6c);
  return __return_storage_ptr__;
}

Assistant:

LinTerms LinearizeProductWithBinaryVar(double c, int x, int y) {
    LinTerms lt;
    MP_ASSERT_ALWAYS(GetMC().is_binary_var(x) ||
                     GetMC().is_binary_var(y),
                     "Can only convert product with a binary variable");
    bool is_x_bin = GetMC().is_binary_var(x);
    auto i_bin = is_x_bin ? x : y;       // index of the (chosen) binary var
    auto i_other = is_x_bin ? y : x;                  // the other var index
    auto x_ifthen = GetMC().AssignResultVar2Args(
          IfThenConstraint {{      // no context as of now
                                   i_bin,
                                   i_other,
                                   int( GetMC().MakeFixedVar(0.0) )
                            }} );
    lt.add_term(c, x_ifthen);
    return lt;
  }